

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

int __thiscall
Centaurus::ATNMachine<unsigned_char>::add_node
          (ATNMachine<unsigned_char> *this,int from,int priority)

{
  reference this_00;
  size_type sVar1;
  int priority_local;
  int from_local;
  ATNMachine<unsigned_char> *this_local;
  
  this_00 = std::
            vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
            ::operator[](&this->m_nodes,(long)from);
  sVar1 = std::
          vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
          ::size(&this->m_nodes);
  ATNNode<unsigned_char>::add_transition(this_00,(int)sVar1,priority);
  std::
  vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>::
  emplace_back<>(&this->m_nodes);
  sVar1 = std::
          vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
          ::size(&this->m_nodes);
  return (int)sVar1 + -1;
}

Assistant:

int add_node(int from, int priority = 0)
    {
        m_nodes[from].add_transition(m_nodes.size(), priority);
        m_nodes.emplace_back();
        return m_nodes.size() - 1;
    }